

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicate
          (xpath_ast_node *this,xpath_node_set_raw *ns,size_t first,xpath_stack *stack,bool once)

{
  xpath_ast_node *this_00;
  xml_attribute_struct *pxVar1;
  bool bVar2;
  long lVar3;
  xpath_node *pxVar4;
  xpath_node *pxVar5;
  size_t sVar6;
  ulong uVar7;
  xpath_node *it;
  xpath_node *pxVar8;
  double dVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  xpath_context c;
  xpath_context local_58;
  undefined1 extraout_var [56];
  
  auVar11 = in_ZMM1._0_16_;
  pxVar4 = ns->_end;
  pxVar5 = ns->_begin;
  uVar7 = (long)pxVar4 - (long)pxVar5 >> 4;
  if (uVar7 == first) {
    return;
  }
  if ((this->_type & 0xfeU) != 0x10) {
    __assert_fail("_type == ast_filter || _type == ast_predicate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                  ,0x262e,
                  "void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate(xpath_node_set_raw &, size_t, const xpath_stack &, bool)"
                 );
  }
  this_00 = this->_right;
  if ((this->_test & 0xfeU) == 2) {
    if (uVar7 < first) {
      __assert_fail("ns.size() >= first",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2610,
                    "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number_const(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &)"
                   );
    }
    if (this_00->_rettype != '\x02') {
      __assert_fail("expr->rettype() == xpath_type_number",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x2611,
                    "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number_const(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &)"
                   );
    }
    local_58.n._node._root = (xml_node_struct *)0x0;
    local_58.n._attribute._attr = (xml_attribute_struct *)0x0;
    local_58.position = 1;
    pxVar5 = pxVar5 + first;
    local_58.size = uVar7 - first;
    auVar10._0_8_ = eval_number(this_00,&local_58,stack);
    auVar10._8_56_ = extraout_var;
    if ((1.0 <= auVar10._0_8_) &&
       (auVar11 = vcvtusi2sd_avx512f(auVar11,uVar7 - first), auVar10._0_8_ <= auVar11._0_8_)) {
      lVar3 = vcvttsd2usi_avx512f(auVar10._0_16_);
      auVar11 = vcvtusi2sd_avx512f(in_XMM2,lVar3);
      if ((auVar10._0_8_ == auVar11._0_8_) && (!NAN(auVar10._0_8_) && !NAN(auVar11._0_8_))) {
        pxVar1 = pxVar5[lVar3 + -1]._attribute._attr;
        (pxVar5->_node)._root = pxVar5[lVar3 + -1]._node._root;
        (pxVar5->_attribute)._attr = pxVar1;
        pxVar5 = pxVar5 + 1;
      }
    }
    if ((ns->_begin <= pxVar5) && (pxVar5 <= ns->_end)) {
      ns->_end = pxVar5;
      return;
    }
    goto LAB_0012d526;
  }
  if (this_00->_rettype == '\x02') {
    if (uVar7 < first) {
      __assert_fail("ns.size() >= first",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x25f6,
                    "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                   );
    }
    pxVar8 = pxVar5 + first;
    if (pxVar8 != pxVar4) {
      sVar6 = 1;
      pxVar4 = pxVar8;
      pxVar5 = pxVar8;
      do {
        local_58.n._node._root = (pxVar4->_node)._root;
        local_58.n._attribute._attr = (pxVar4->_attribute)._attr;
        local_58.position = sVar6;
        local_58.size = uVar7 - first;
        dVar9 = eval_number(this_00,&local_58,stack);
        auVar11 = vcvtusi2sd_avx512f(in_XMM2,sVar6);
        if ((dVar9 == auVar11._0_8_) && (!NAN(dVar9) && !NAN(auVar11._0_8_))) {
          pxVar1 = (pxVar4->_attribute)._attr;
          (pxVar5->_node)._root = (pxVar4->_node)._root;
          (pxVar5->_attribute)._attr = pxVar1;
          pxVar5 = pxVar5 + 1;
          if (once) goto LAB_0012d4dc;
        }
        pxVar4 = pxVar4 + 1;
        sVar6 = sVar6 + 1;
      } while (pxVar4 != ns->_end);
LAB_0012d4e0:
      pxVar8 = pxVar5;
      pxVar5 = ns->_begin;
    }
  }
  else {
    if (uVar7 < first) {
      __assert_fail("ns.size() >= first",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0x25dc,
                    "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_boolean(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                   );
    }
    pxVar8 = pxVar5 + first;
    if (pxVar8 != pxVar4) {
      sVar6 = 1;
      pxVar5 = pxVar8;
      do {
        local_58.n._node._root = (pxVar8->_node)._root;
        local_58.n._attribute._attr = (pxVar8->_attribute)._attr;
        local_58.position = sVar6;
        local_58.size = uVar7 - first;
        bVar2 = eval_boolean(this_00,&local_58,stack);
        if (bVar2) {
          pxVar1 = (pxVar8->_attribute)._attr;
          (pxVar5->_node)._root = (pxVar8->_node)._root;
          (pxVar5->_attribute)._attr = pxVar1;
          pxVar5 = pxVar5 + 1;
          if (once) goto LAB_0012d4dc;
        }
        pxVar8 = pxVar8 + 1;
        sVar6 = sVar6 + 1;
        pxVar4 = pxVar8;
      } while (pxVar8 != ns->_end);
      goto LAB_0012d4e0;
    }
  }
  if ((pxVar5 <= pxVar8) && (pxVar8 <= pxVar4)) {
    ns->_end = pxVar8;
    return;
  }
LAB_0012d526:
  __assert_fail("_begin <= pos && pos <= _end",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                ,0x22e6,
                "void pugi::impl::(anonymous namespace)::xpath_node_set_raw::truncate(xpath_node *)"
               );
LAB_0012d4dc:
  pxVar4 = ns->_end;
  goto LAB_0012d4e0;
}

Assistant:

void apply_predicate(xpath_node_set_raw& ns, size_t first, const xpath_stack& stack, bool once)
		{
			if (ns.size() == first) return;

			assert(_type == ast_filter || _type == ast_predicate);

			if (_test == predicate_constant || _test == predicate_constant_one)
				apply_predicate_number_const(ns, first, _right, stack);
			else if (_right->rettype() == xpath_type_number)
				apply_predicate_number(ns, first, _right, stack, once);
			else
				apply_predicate_boolean(ns, first, _right, stack, once);
		}